

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O0

char * bc_strdup_vprintf(char *format,__va_list_tag *ap)

{
  int iVar1;
  int l2;
  char *tmp;
  undefined8 uStack_38;
  int l;
  va_list ap2;
  __va_list_tag *ap_local;
  char *format_local;
  
  if (format == (char *)0x0) {
    format_local = (char *)0x0;
  }
  else {
    ap2[0].overflow_arg_area = ap->reg_save_area;
    uStack_38._0_4_ = ap->gp_offset;
    uStack_38._4_4_ = ap->fp_offset;
    ap2[0]._0_8_ = ap->overflow_arg_area;
    ap2[0].reg_save_area = ap;
    iVar1 = vsnprintf((char *)0x0,0,format,&uStack_38);
    if (iVar1 < 0) {
      format_local = (char *)0x0;
    }
    else {
      format_local = (char *)malloc((long)(iVar1 + 1));
      if (format_local == (char *)0x0) {
        format_local = (char *)0x0;
      }
      else {
        iVar1 = vsnprintf(format_local,(long)(iVar1 + 1),format,ap2[0].reg_save_area);
        if (iVar1 < 0) {
          free(format_local);
          format_local = (char *)0x0;
        }
      }
    }
  }
  return format_local;
}

Assistant:

char*
bc_strdup_vprintf(const char *format, va_list ap)
{
    if (format == NULL)
        return NULL;
    va_list ap2;
    va_copy(ap2, ap);
    int l = vsnprintf(NULL, 0, format, ap2);
    va_end(ap2);
    if (l < 0)
        return NULL;
    char *tmp = malloc(l + 1);
    if (!tmp)
        return NULL;
    int l2 = vsnprintf(tmp, l + 1, format, ap);
    if (l2 < 0) {
        free(tmp);
        return NULL;
    }
    return tmp;
}